

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

int __thiscall gdscpp::genDot(gdscpp *this,string *fileName)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  FILE *__stream;
  pointer pgVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int j;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fromSTR;
  string lineStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toSTR;
  string bashCmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Generating Dot file:\"");
  poVar3 = std::operator<<(poVar3,(string *)fileName);
  poVar3 = std::operator<<(poVar3,"\" file");
  std::endl<char,std::char_traits<char>>(poVar3);
  fromSTR.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fromSTR.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fromSTR.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  toSTR.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  toSTR.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  toSTR.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pgVar4 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)pgVar4) / 0xf8);
      uVar7 = uVar7 + 1) {
    for (uVar8 = 0;
        uVar8 < (ulong)(((long)*(pointer *)
                                ((long)&pgVar4[uVar7].SREF.
                                        super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>.
                                        _M_impl + 8) -
                        *(long *)&pgVar4[uVar7].SREF.
                                  super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl) /
                       0x78); uVar8 = uVar8 + 1) {
      uVar5 = 0;
      while( true ) {
        uVar6 = (ulong)uVar5;
        if ((ulong)((long)fromSTR.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)fromSTR.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) break;
        iVar1 = std::__cxx11::string::compare
                          ((string *)
                           (fromSTR.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar6));
        if (iVar1 == 0) {
          iVar1 = std::__cxx11::string::compare
                            ((string *)
                             (toSTR.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar6));
          if (iVar1 == 0) goto LAB_001084ba;
        }
        uVar5 = uVar5 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&fromSTR,&(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7].name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&toSTR,(value_type *)
                         (*(long *)&(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar7].SREF.
                                    super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl +
                          uVar8 * 0x78 + 8));
LAB_001084ba:
      pgVar4 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  __stream = fopen("foo.dot","w");
  lineStr._M_dataplus._M_p = (pointer)&lineStr.field_2;
  lineStr._M_string_length = 0;
  lineStr.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&lineStr);
  fputs(lineStr._M_dataplus._M_p,__stream);
  uVar5 = 0;
  while( true ) {
    uVar7 = (ulong)uVar5;
    if ((ulong)((long)fromSTR.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)fromSTR.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7) break;
    std::operator+(&local_70,"\t",
                   fromSTR.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar7);
    std::operator+(&local_50,&local_70," -> ");
    std::operator+(&local_90,&local_50,
                   toSTR.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar7);
    std::operator+(&bashCmd,&local_90,";\n");
    std::__cxx11::string::operator=((string *)&lineStr,(string *)&bashCmd);
    std::__cxx11::string::~string((string *)&bashCmd);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    fputs(lineStr._M_dataplus._M_p,__stream);
    uVar5 = uVar5 + 1;
  }
  std::__cxx11::string::assign((char *)&lineStr);
  fputs(lineStr._M_dataplus._M_p,__stream);
  fclose(__stream);
  poVar3 = std::operator<<((ostream *)&std::cout,"Dot file done.");
  std::endl<char,std::char_traits<char>>(poVar3);
  bashCmd._M_dataplus._M_p = (pointer)&bashCmd.field_2;
  bashCmd._M_string_length = 0;
  bashCmd.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_90,"dot -Tjpg foo.dot -o ",fileName);
  std::__cxx11::string::operator=((string *)&bashCmd,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  iVar1 = system(bashCmd._M_dataplus._M_p);
  if (iVar1 != -1) {
    std::__cxx11::string::assign((char *)&bashCmd);
    iVar2 = system(bashCmd._M_dataplus._M_p);
    iVar1 = 0;
    if (iVar2 != -1) goto LAB_001086f3;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Bash command :\"");
  poVar3 = std::operator<<(poVar3,(string *)&bashCmd);
  poVar3 = std::operator<<(poVar3,"\" error.");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar1 = 1;
LAB_001086f3:
  std::__cxx11::string::~string((string *)&bashCmd);
  std::__cxx11::string::~string((string *)&lineStr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&toSTR);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fromSTR);
  return iVar1;
}

Assistant:

int gdscpp::genDot(const std::string &fileName)
{
  cout << "Generating Dot file:\"" << fileName << "\" file" << endl;

  vector<string> fromSTR;
  vector<string> toSTR;

  bool foundSTR;
  for (int i = 0; i < this->STR.size(); i++) {
    for (int j = 0; j < this->STR[i].SREF.size(); j++) {
      foundSTR = true;
      for (unsigned int k = 0; k < fromSTR.size(); k++) {
        if (!fromSTR[k].compare(this->STR[i].name) &&
            !toSTR[k].compare(this->STR[i].SREF[j].name)) {
          foundSTR = false;
          break;
        }
      }
      if (foundSTR) {
        fromSTR.push_back(this->STR[i].name);
        toSTR.push_back(this->STR[i].SREF[j].name);
      }
    }
  }

  // ------------------------ creating dot file ------------------------

  FILE *dotFile;
  dotFile = fopen("foo.dot", "w");

  string lineStr;

  lineStr = "digraph GDStree {\n";
  fputs(lineStr.c_str(), dotFile);

  for (unsigned int i = 0; i < fromSTR.size(); i++) {
    lineStr = "\t" + fromSTR[i] + " -> " + toSTR[i] + ";\n";
    fputs(lineStr.c_str(), dotFile);
  }

  lineStr = "}";
  fputs(lineStr.c_str(), dotFile);

  fclose(dotFile);
  cout << "Dot file done." << endl;

  // ------------------------ executing dot script ------------------------
  string bashCmd;
  bashCmd = "dot -Tjpg foo.dot -o " + fileName;

  if (system(bashCmd.c_str()) == -1) {
    cout << "Bash command :\"" << bashCmd << "\" error." << endl;
    return 1;
  }

  bashCmd = "rm foo.dot";
  if (system(bashCmd.c_str()) == -1) {
    cout << "Bash command :\"" << bashCmd << "\" error." << endl;
    return 1;
  }

  return 0;
}